

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> __thiscall
Parser::parseCommandSequence(Parser *this,char indicator,initializer_list<const_char_*> terminators)

{
  TokenType TVar1;
  iterator this_00;
  char *__s;
  bool bVar2;
  int iVar3;
  CommandSequence *this_01;
  Token *pTVar4;
  undefined4 extraout_var;
  Token *args;
  size_type __rlen;
  undefined7 in_register_00000031;
  Parser *this_02;
  _Base_ptr in_R8;
  long lVar5;
  bool bVar6;
  bool bVar7;
  unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> cmd;
  _Head_base<0UL,_CAssemblerCommand_*,_false> local_a0;
  undefined1 local_98 [24];
  long local_80;
  undefined1 local_78 [24];
  _Base_ptr local_60;
  size_t local_58;
  Token *local_50;
  _Head_base<0UL,_CAssemblerCommand_*,_false> local_48;
  _Base_ptr local_40;
  _Base_ptr local_38;
  
  this_02 = (Parser *)CONCAT71(in_register_00000031,indicator);
  args = (Token *)terminators._M_len;
  local_98._12_4_ = terminators._M_array._0_4_;
  local_50 = args;
  local_48._M_head_impl = (CAssemblerCommand *)this;
  this_01 = (CommandSequence *)operator_new(0x30);
  CommandSequence::CommandSequence(this_01);
  bVar6 = in_R8 != (_Base_ptr)0x0;
  local_58 = (long)in_R8 * 8;
  local_60 = (_Base_ptr)0x0;
  local_78._16_8_ = this_01;
  local_40 = in_R8;
LAB_00145f0e:
  this_00._M_node =
       (_List_node_base *)
       (this_02->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
       _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer;
  if ((_List_node_base *)((TokenizerPosition *)((long)(this_00._M_node + 1) + 8))->it !=
      this_00._M_node) {
    pTVar4 = Tokenizer::peekToken((Tokenizer *)this_00._M_node,0);
    TVar1 = pTVar4->type;
    args = (Token *)(ulong)TVar1;
    if (TVar1 == Identifier) {
      if (*(__index_type *)
           ((long)&(pTVar4->value).
                   super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                   super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                   .
                   super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                   .super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                   super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                   super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
           + 0x20) != '\x04') {
        __assert_fail("std::holds_alternative<Identifier>(value)",
                      "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Parser/Tokenizer.h"
                      ,0x4d,"const Identifier &Token::identifierValue() const");
      }
      local_38 = *(_Base_ptr *)
                  &(pTVar4->value).
                   super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                   super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                   .
                   super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                   .super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                   super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                   super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                   ._M_u;
      args = (Token *)(ulong)(uint)local_98._12_4_;
      if ((char)local_38->_M_color == (char)local_98._12_4_) {
        args = (Token *)(ulong)CONCAT31(SUB43(local_98._12_4_,1),bVar6);
        bVar7 = bVar6;
        if (in_R8 != (_Base_ptr)0x0) {
          args = *(Token **)
                  ((long)&(pTVar4->value).
                          super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                          .
                          super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                          .
                          super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                          .
                          super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                          .
                          super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                          .
                          super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                  + 8);
          bVar7 = true;
          lVar5 = 0;
          do {
            __s = *(char **)(lVar5 + (long)&local_50->line);
            pTVar4 = (Token *)strlen(__s);
            if (args == pTVar4) {
              if (args == (Token *)0x0) break;
              iVar3 = bcmp(local_38,__s,(size_t)args);
              pTVar4 = (Token *)CONCAT44(extraout_var,iVar3);
              if (iVar3 == 0) break;
            }
            lVar5 = lVar5 + 8;
            bVar7 = local_58 != lVar5;
          } while (bVar7);
        }
        in_R8 = local_40;
        if (!bVar7) goto LAB_00145fee;
        local_60 = (_Base_ptr)CONCAT71((int7)((ulong)pTVar4 >> 8),1);
        iVar3 = 3;
        bVar7 = false;
      }
      else {
LAB_00145fee:
        iVar3 = 0;
        bVar7 = true;
      }
      if (bVar7) {
LAB_00145ffb:
        bVar7 = false;
LAB_00145ffd:
        bVar2 = checkEquLabel(this_02);
        if (!bVar2) {
          bVar2 = checkMacroDefinition(this_02);
          if (!bVar2) {
            bVar2 = checkExpFuncDefinition(this_02);
            if (!bVar2) goto LAB_0014605c;
          }
        }
        bVar7 = true;
        if (this_02->error == true) {
          handleError((Parser *)local_98);
          std::
          vector<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>,std::allocator<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>>>
          ::emplace_back<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>>
                    ((vector<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>,std::allocator<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>>>
                      *)&this_01->commands,
                     (unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *)
                     local_98);
          if ((pointer)local_98._0_8_ != (pointer)0x0) {
            (*(code *)((*(Tokenizer **)local_98._0_8_)->tokens).
                      super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
                      super__List_node_base._M_prev)();
          }
          local_98._0_8_ = (pointer)0x0;
        }
        goto LAB_00145ffd;
      }
    }
    else {
      if (TVar1 != Separator) goto LAB_00145ffb;
      iVar3 = 2;
      Tokenizer::eatTokens
                ((this_02->entries).
                 super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1].tokenizer,1);
    }
    goto LAB_001460d4;
  }
  goto LAB_001460de;
LAB_0014605c:
  iVar3 = 2;
  if (!bVar7) {
    parseCommand((Parser *)(local_98 + 0x10));
    iVar3 = 2;
    if ((this_02->conditionStack).
        super__Vector_base<Parser::ConditionInfo,_std::allocator<Parser::ConditionInfo>_>._M_impl.
        super__Vector_impl_data._M_finish[-1].inTrueBlock != false) {
      local_a0._M_head_impl = (CAssemblerCommand *)local_98._16_8_;
      local_98._16_8_ = (CAssemblerCommand *)0x0;
      std::
      vector<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>,std::allocator<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>>>
      ::emplace_back<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>>
                ((vector<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>,std::allocator<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>>>
                  *)&this_01->commands,
                 (unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *)&local_a0
                );
      if (local_a0._M_head_impl != (CAssemblerCommand *)0x0) {
        (*(code *)(((Tokenizer *)(local_a0._M_head_impl)->_vptr_CAssemblerCommand)->tokens).
                  super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
                  super__List_node_base._M_prev)();
      }
      local_a0._M_head_impl = (CAssemblerCommand *)0x0;
      iVar3 = 0;
    }
    if ((CAssemblerCommand *)local_98._16_8_ != (CAssemblerCommand *)0x0) {
      (*(code *)*(_List_node_base **)
                 ((long)&((*(Tokenizer **)local_98._16_8_)->tokens).
                         super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
                         super__List_node_base + 8))();
    }
  }
LAB_001460d4:
  if (iVar3 == 3) {
LAB_001460de:
    if (in_R8 != (_Base_ptr)0x0 && ((ulong)local_60 & 1) == 0) {
      local_80 = 0;
      local_78[0] = _S_red;
      lVar5 = 0;
      local_98._16_8_ = (pointer)local_78;
      do {
        if (local_80 != 0) {
          std::__cxx11::string::append(local_98 + 0x10);
        }
        std::__cxx11::string::append(local_98 + 0x10);
        lVar5 = lVar5 + 8;
      } while (local_58 != lVar5);
      Logger::printError<std::__cxx11::string>
                ((Logger *)0x1,0x18aca1,local_98 + 0x10,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
      if ((pointer)local_98._16_8_ != (pointer)local_78) {
        operator_delete((void *)local_98._16_8_,CONCAT71(local_78._1_7_,local_78[0]) + 1);
      }
    }
    (local_48._M_head_impl)->_vptr_CAssemblerCommand = (_func_int **)local_78._16_8_;
    return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
           (tuple<CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>)
           local_48._M_head_impl;
  }
  goto LAB_00145f0e;
}

Assistant:

std::unique_ptr<CAssemblerCommand> Parser::parseCommandSequence(char indicator, const std::initializer_list<const char*> terminators)
{
	auto sequence = std::make_unique<CommandSequence>();

	bool foundTermination = false;
	while (!atEnd())
	{
		const Token &next = peekToken();

		if(next.type == TokenType::Separator)
		{
			eatToken();
			continue;
		}

		if (next.type == TokenType::Identifier)
		{
			const auto &identifier = next.identifierValue();
			if (identifier.startsWith(indicator) && isPartOfList(identifier, terminators))
			{
				foundTermination = true;
				break;
			}
		}

		bool foundSomething = false;
		while (checkEquLabel() || checkMacroDefinition() || checkExpFuncDefinition())
		{
			// do nothing, just parse all the equs and macros there are
			if (hasError())
				sequence->addCommand(handleError());

			foundSomething = true;
		}

		if (foundSomething)
			continue;

		std::unique_ptr<CAssemblerCommand> cmd = parseCommand();

		// omit commands inside blocks that are trivially false
		if (!isInsideTrueBlock())
		{
			continue;
		}

		sequence->addCommand(std::move(cmd));
	}

	if (!foundTermination && terminators.size())
	{
		std::string expected;
		for (const char* terminator : terminators)
		{
			if (!expected.empty())
				expected += ", ";
			expected += terminator;
		}

		Logger::printError(Logger::Error, "Unterminated command sequence, expected any of %s.", expected);
	}

	return sequence;
}